

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

void google::protobuf::compiler::java::PrintEnumVerifierLogic
               (Printer *printer,FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,char *var_name,char *terminating_string,bool enforce_lite)

{
  char *text;
  AlphaNum *c;
  AlphaNum local_1d8;
  AlphaNum local_198;
  string local_168;
  AlphaNum local_148;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  undefined1 local_58 [8];
  string enum_verifier_string;
  bool enforce_lite_local;
  char *terminating_string_local;
  char *var_name_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldDescriptor *descriptor_local;
  Printer *printer_local;
  
  enum_verifier_string.field_2._M_local_buf[0xf] = enforce_lite;
  if (enforce_lite) {
    strings::AlphaNum::AlphaNum(&local_88,var_name);
    strings::AlphaNum::AlphaNum(&local_b8,".internalGetVerifier()");
    StrCat_abi_cxx11_((string *)local_58,(protobuf *)&local_88,&local_b8,(AlphaNum *)var_name);
  }
  else {
    c = (AlphaNum *)terminating_string;
    strings::AlphaNum::AlphaNum
              (&local_e8,
               "new com.google.protobuf.Internal.EnumVerifier() {\n        @java.lang.Override\n        public boolean isInRange(int number) {\n          return "
              );
    strings::AlphaNum::AlphaNum(&local_118,var_name);
    strings::AlphaNum::AlphaNum(&local_148,".forNumber(number) != null;\n        }\n      }");
    var_name = (char *)&local_148;
    StrCat_abi_cxx11_((string *)local_58,(protobuf *)&local_e8,&local_118,(AlphaNum *)var_name,c);
  }
  strings::AlphaNum::AlphaNum(&local_198,(string *)local_58);
  strings::AlphaNum::AlphaNum(&local_1d8,terminating_string);
  StrCat_abi_cxx11_(&local_168,(protobuf *)&local_198,&local_1d8,(AlphaNum *)var_name);
  text = (char *)std::__cxx11::string::c_str();
  io::Printer::Print(printer,variables,text);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void PrintEnumVerifierLogic(io::Printer* printer,
                            const FieldDescriptor* descriptor,
                            const std::map<std::string, std::string>& variables,
                            const char* var_name,
                            const char* terminating_string, bool enforce_lite) {
  std::string enum_verifier_string =
      enforce_lite ? StrCat(var_name, ".internalGetVerifier()")
                   : StrCat(
                         "new com.google.protobuf.Internal.EnumVerifier() {\n"
                         "        @java.lang.Override\n"
                         "        public boolean isInRange(int number) {\n"
                         "          return ",
                         var_name,
                         ".forNumber(number) != null;\n"
                         "        }\n"
                         "      }");
  printer->Print(
      variables,
      StrCat(enum_verifier_string, terminating_string).c_str());
}